

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

bool iutest::internal::StrNeHelper::Compare<char32_t_const*,std::__cxx11::u32string>
               (char32_t **val1,
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *val2)

{
  bool bVar1;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> __y;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_20;
  
  detail::iu_nullable_basic_string_view<char32_t,_std::char_traits<char32_t>_>::
  iu_nullable_basic_string_view
            ((iu_nullable_basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&local_20,*val1
            );
  __y._M_str = (val2->_M_dataplus)._M_p;
  __y._M_len = val2->_M_string_length;
  bVar1 = std::operator==(local_20,__y);
  return !bVar1;
}

Assistant:

inline bool IUTEST_ATTRIBUTE_UNUSED_ Compare(const T1& val1, const T2& val2)
{
    return !StrEqHelper::Compare(val1, val2);
}